

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentupdate.cpp
# Opt level: O2

void test_concurrent_update::read_total_balance(DuckDB *db,bool *read_correct)

{
  bool bVar1;
  initializer_list<duckdb::Value> __l;
  allocator_type local_b9;
  long *local_b8;
  bool *local_b0;
  Connection con;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_88;
  string local_70 [64];
  
  *read_correct = true;
  local_b0 = read_correct;
  duckdb::Connection::Connection(&con,db);
  while ((finished_updating & 1) == 0) {
    std::__cxx11::string::string(local_70,"SELECT SUM(money) FROM accounts",(allocator *)&local_b9);
    duckdb::Connection::Query((string *)&local_b8);
    std::__cxx11::string::~string(local_70);
    duckdb::Value::Value((Value *)local_70,100);
    __l._M_len = 1;
    __l._M_array = (iterator)local_70;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_88,__l,&local_b9);
    bVar1 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                        *)&local_b8,0,(vector<duckdb::Value,_true> *)&local_88);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_88);
    duckdb::Value::~Value((Value *)local_70);
    if (!bVar1) {
      *local_b0 = false;
    }
    if (local_b8 != (long *)0x0) {
      (**(code **)(*local_b8 + 8))();
    }
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void read_total_balance(DuckDB *db, bool *read_correct) {
	*read_correct = true;
	Connection con(*db);
	while (!finished_updating) {
		// the total balance should remain constant regardless of updates
		auto result = con.Query("SELECT SUM(money) FROM accounts");
		if (!CHECK_COLUMN(result, 0, {CONCURRENT_UPDATE_TOTAL_ACCOUNTS * CONCURRENT_UPDATE_MONEY_PER_ACCOUNT})) {
			*read_correct = false;
		}
	}
}